

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::EqHelper<false>::Compare<(anonymous_namespace)::weekday,signed_char>
          (EqHelper<false> *this,char *lhs_expression,char *rhs_expression,weekday *lhs,char *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar3;
  string local_60;
  string local_40;
  
  if (lhs->value_ == *rhs) {
    AVar3 = AssertionSuccess();
    return AVar3;
  }
  PrintToString<(anonymous_namespace)::weekday>(&local_40,lhs);
  PrintToString<signed_char>(&local_60,rhs);
  AVar3 = EqFailure((internal *)this,lhs_expression,rhs_expression,&local_40,&local_60,false);
  sVar2 = AVar3.message_.ptr_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    sVar2.ptr_ = extraout_RDX;
  }
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    paVar1 = extraout_RAX;
    sVar2.ptr_ = extraout_RDX_00;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = paVar1;
  return AVar3;
}

Assistant:

static AssertionResult Compare(const char* lhs_expression,
                                 const char* rhs_expression,
                                 const T1& lhs,
                                 const T2& rhs) {
    return CmpHelperEQ(lhs_expression, rhs_expression, lhs, rhs);
  }